

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

size_t __thiscall pfederc::Lexer::getLineNumber(Lexer *this,size_t index)

{
  pointer puVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  string sStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (this->currentEndIndex < index) {
    std::__cxx11::to_string(&sStack_48,index);
    std::operator+(&local_28,"Out of bounds: ",&sStack_48);
    fatal("lexer.cpp",0x46,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)&sStack_48);
    sVar3 = 0;
  }
  else {
    puVar1 = (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar4 = (long)(this->lineIndices).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    do {
      sVar3 = sVar4 - 1;
      lVar2 = sVar4 - 1;
      sVar4 = sVar3;
    } while (index < puVar1[lVar2]);
  }
  return sVar3;
}

Assistant:

size_t Lexer::getLineNumber(size_t index) const noexcept {
  if (index > currentEndIndex) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(index));
    return 0;
  }

  size_t lineIndex = lineIndices.size() - 1;
  for (; index < lineIndices[lineIndex]; --lineIndex);

  return lineIndex;
}